

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

void __thiscall higan::FileForAppend::Append(FileForAppend *this,char *data,size_t len)

{
  FILE *__stream;
  int __errnum;
  size_t sVar1;
  undefined8 uVar2;
  char *pcVar3;
  int error;
  size_t write_result;
  size_t has_writen;
  size_t len_local;
  char *data_local;
  FileForAppend *this_local;
  
  write_result = Write(this,data,len);
  do {
    if (len <= write_result) {
LAB_00154f73:
      this->write_sum_bytes_ = write_result + this->write_sum_bytes_;
      return;
    }
    sVar1 = Write(this,data + write_result,len - write_result);
    if (sVar1 == 0) {
      __errnum = ferror((FILE *)this->file_fp_);
      __stream = _stderr;
      if (__errnum != 0) {
        uVar2 = std::__cxx11::string::c_str();
        pcVar3 = strerror(__errnum);
        fprintf(__stream,"write file %s error error msg is: %s",uVar2,pcVar3);
      }
      goto LAB_00154f73;
    }
    write_result = sVar1 + write_result;
  } while( true );
}

Assistant:

void FileForAppend::Append(const char* data, size_t len)
{
	size_t has_writen = 0;
	/**
	 * 默认第一次 成功..
	 */
	size_t write_result = Write(data, len);

	has_writen += write_result;

	while (has_writen < len)
	{
		write_result = Write(data + has_writen, len - has_writen);
		if (write_result > 0)
		{
			has_writen += write_result;
		}
		else if (write_result == 0)
		{
			int error = ferror(file_fp_);
			if (error)
			{
				fprintf(stderr, "write file %s error error msg is: %s",
						url_.c_str(), strerror(error));
			}
			break;
		}
	}

	write_sum_bytes_ += has_writen;
}